

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O1

bool __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPointAtLevel
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,Image<const_unsigned_short> *img_2,
          PatchT *dp,AffineCompact2f *transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  bool bVar7;
  Index outer;
  long lVar8;
  ActualDstType actualDst;
  undefined8 unaff_RBP;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  double __x;
  float fVar12;
  float fVar13;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Vector3 inc;
  Matrix2P transformed_pat;
  VectorP res;
  assign_op<float,_float> local_341;
  PatchT *local_340;
  Image<const_unsigned_short> *local_338;
  uint local_32c;
  Matrix3P *local_328;
  plainobjectbase_evaluator_data<float,_0> local_320;
  undefined1 local_318 [8];
  undefined8 local_310;
  assign_op<float,_float> *local_308;
  DstXprType *local_300;
  undefined8 local_2f8;
  float local_2f0;
  float local_2ec;
  VectorP *local_2e8;
  Matrix3P *local_2d8;
  VectorP *local_2d0;
  undefined8 local_2c8;
  DstXprType local_2b4;
  Matrix2P local_2a8;
  VectorP local_108;
  
  local_328 = &dp->H_se2_inv_J_se2_T;
  uVar9 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  uVar10 = 0;
  local_340 = dp;
  local_338 = img_2;
  do {
    fVar1 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array[0];
    fVar2 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array[1];
    fVar3 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array[2];
    fVar11 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[3];
    lVar8 = 0;
    do {
      fVar4 = (float)(&OpticalFlowPatch<float,vo::Pattern51<float>>::pattern2)[lVar8 * 2];
      fVar5 = (float)(&DAT_001456f4)[lVar8 * 2];
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar8 * 2] = fVar3 * fVar5 + fVar1 * fVar4;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar8 * 2U + 1] = fVar5 * fVar11 + fVar4 * fVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x34);
    fVar1 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array[4];
    fVar2 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
            m_storage.m_data.array[5];
    lVar8 = 0;
    do {
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar8 * 2] = local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                    m_storage.m_data.array[lVar8 * 2] + fVar1;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar8 * 2U + 1] =
           local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.
           array[lVar8 * 2U + 1] + fVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x34);
    bVar7 = OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
                      (dp,local_338,&local_2a8,&local_108);
    if (bVar7) {
      local_32c = (uint)uVar9;
      local_2f8 = local_328;
      local_2d8 = local_328;
      local_2c8 = 0x34;
      local_320.data = (float *)&local_2b4;
      local_318 = (undefined1  [8])&local_320;
      local_308 = &local_341;
      local_310 = (SO2Base<Sophus::SO2<float,_0>_> *)&local_2f8;
      local_300 = (DstXprType *)local_320.data;
      local_2e8 = &local_108;
      local_2d0 = &local_108;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_318);
      Sophus::SE2Base<Sophus::SE2<float,_0>_>::exp((SE2Base<Sophus::SE2<float,_0>_> *)local_318,__x)
      ;
      Sophus::SO2Base<Sophus::SO2<float,_0>_>::matrix((SO2Base<Sophus::SO2<float,_0>_> *)&local_2f8)
      ;
      fVar1 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array[0];
      fVar2 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array[1];
      fVar3 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array[2];
      fVar11 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
               m_storage.m_data.array[4];
      fVar12 = fVar11 * 0.0;
      fVar4 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array[3];
      fVar5 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array[5];
      fVar13 = fVar5 * 0.0;
      fVar11 = fVar3 * local_310._4_4_ + fVar11 + fVar1 * (float)local_310;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[0] = local_2f8._4_4_ * fVar3 + fVar12 + (float)local_2f8 * fVar1;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[1] = local_2f8._4_4_ * fVar4 + fVar13 + (float)local_2f8 * fVar2;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[2] = local_2ec * fVar3 + fVar12 + local_2f0 * fVar1;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[3] = local_2ec * fVar4 + fVar13 + local_2f0 * fVar2;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[4] = fVar11;
      (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
      m_data.array[5] = local_310._4_4_ * fVar4 + fVar5 + (float)local_310 * fVar2;
      dp = local_340;
      if ((fVar11 < 2.0) || ((float)(int)local_338->w + -2.0 + -1.0 <= fVar11)) {
        uVar9 = 0;
      }
      else {
        fVar1 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
                m_storage.m_data.array[5];
        if (fVar1 < 2.0) goto LAB_0012d6c9;
        uVar6 = local_32c & 0xff;
        if ((float)(int)local_338->h + -2.0 + -1.0 <= fVar1) {
          uVar6 = 0;
        }
        uVar9 = (ulong)uVar6;
      }
    }
    else {
LAB_0012d6c9:
      uVar9 = 0;
    }
    if (((uVar9 & 1) == 0) || (bVar7 = 3 < uVar10, uVar10 = uVar10 + 1, bVar7)) {
      return (bool)((byte)uVar9 & 1);
    }
  } while( true );
}

Assistant:

inline bool trackPointAtLevel(const Image<const u_int16_t>& img_2,
                                const PatchT& dp,
                                Eigen::AffineCompact2f& transform) const {
    bool patch_valid = true;

    for (int iteration = 0;
         patch_valid && iteration < optical_flow_max_iterations; iteration++) {
      typename PatchT::VectorP res;

      typename PatchT::Matrix2P transformed_pat =
          transform.linear().matrix() * PatchT::pattern2;
      transformed_pat.colwise() += transform.translation();

      bool valid = dp.residual(img_2, transformed_pat, res);

      if (valid) {
        Vector3 inc = -dp.H_se2_inv_J_se2_T * res;
        transform *= SE2::exp(inc).matrix();

        const int filter_margin = 2;

        if (!img_2.InBounds(transform.translation(), filter_margin))
          patch_valid = false;
      } else {
        patch_valid = false;
      }
    }

    return patch_valid;
  }